

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::SimpleNode::AnnotatePass3
          (SimpleNode *this,Compiler *compiler,CountDomain accumConsumes,
          CharSet<char16_t> *accumFollow,bool accumFollowIrrefutable,bool accumFollowEOL)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  
  (this->super_Node).followConsumes = accumConsumes;
  (this->super_Node).followSet = accumFollow;
  uVar1 = *(uint *)&(this->super_Node).field_0xc;
  uVar2 = (int)CONCAT71(in_register_00000089,accumFollowEOL) * 0x100 +
          (int)CONCAT71(in_register_00000081,accumFollowIrrefutable) * 4 | uVar1 & 0xfffffefb;
  *(uint *)&(this->super_Node).field_0xc = uVar2;
  uVar3 = 0;
  if ((((this->super_Node).tag == BOL) &&
      ((this->super_Node).prevConsumes.upper == 0 && (this->super_Node).prevConsumes.lower == 0)) &&
     ((~uVar1 & 0x2800) == 0 && (compiler->program->flags & MultilineRegexFlag) == NoRegexFlags)) {
    uVar3 = (uVar1 & 0x80) << 7;
  }
  *(uint *)&(this->super_Node).field_0xc = uVar2 & 0xffffbfff | uVar3;
  return;
}

Assistant:

void SimpleNode::AnnotatePass3(Compiler& compiler, CountDomain accumConsumes, CharSet<Char>* accumFollow, bool accumFollowIrrefutable, bool accumFollowEOL)
    {
        followConsumes = accumConsumes;
        followSet = accumFollow;
        isFollowIrrefutable = accumFollowIrrefutable;
        isFollowEOL = accumFollowEOL;

        hasInitialHardFailBOI = ((tag == BOL) &&
            prevConsumes.IsExact(0) &&
            (compiler.program->flags & MultilineRegexFlag) == 0 &&
            isAtLeastOnce &&
            isNotNegated &&
            isPrevWillNotRegress);
    }